

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,true>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  ulong idx;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar13;
  interval_t left;
  interval_t left_00;
  interval_t left_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar11 = &ldata->micros;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      uVar3 = ((interval_t *)(piVar11 + -1))->months;
      uVar8 = ((interval_t *)(piVar11 + -1))->days;
      left_01.days = uVar8;
      left_01.months = uVar3;
      left_01.micros = *piVar11;
      bVar9 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                        (fun,left_01,*rdata,mask,idx_00);
      result_data[idx_00] = bVar9;
      piVar11 = piVar11 + 2;
    }
  }
  else {
    idx_01 = 0;
    for (uVar10 = 0; uVar10 != count + 0x3f >> 6; uVar10 = uVar10 + 1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar13 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar13 = count;
        }
LAB_01329a80:
        piVar11 = &ldata[idx_01].micros;
        for (; idx = idx_01, idx_01 < uVar13; idx_01 = idx_01 + 1) {
          uVar1 = ((interval_t *)(piVar11 + -1))->months;
          uVar6 = ((interval_t *)(piVar11 + -1))->days;
          left.days = uVar6;
          left.months = uVar1;
          left.micros = *piVar11;
          bVar9 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                            (fun,left,*rdata,mask,idx_01);
          result_data[idx_01] = bVar9;
          piVar11 = piVar11 + 2;
        }
      }
      else {
        uVar5 = puVar4[uVar10];
        uVar13 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar13 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_01329a80;
        idx = uVar13;
        if (uVar5 != 0) {
          piVar11 = &ldata[idx_01].micros;
          for (uVar12 = 0; idx = uVar12 + idx_01, idx < uVar13; uVar12 = uVar12 + 1) {
            if ((uVar5 >> (uVar12 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar11 + -1))->months;
              uVar7 = ((interval_t *)(piVar11 + -1))->days;
              left_00.days = uVar7;
              left_00.months = uVar2;
              left_00.micros = *piVar11;
              bVar9 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                                (fun,left_00,*rdata,mask,idx);
              result_data[uVar12 + idx_01] = bVar9;
            }
            piVar11 = piVar11 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}